

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch.cpp
# Opt level: O1

size_t minisketch_merge(minisketch *sketch,minisketch *other_sketch)

{
  size_t sVar1;
  long in_FS_OFFSET;
  
  if ((*(long *)(sketch + 8) == 0x6d496e536b65) && (*(long *)(other_sketch + 8) == 0x6d496e536b65))
  {
    if ((*(int *)(sketch + 0x14) == *(int *)(other_sketch + 0x14)) &&
       (*(int *)(sketch + 0x10) == *(int *)(other_sketch + 0x10))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
        sVar1 = (**(code **)(*(long *)sketch + 0x38))();
        return sVar1;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      return 0;
    }
    __stack_chk_fail();
  }
  abort();
}

Assistant:

size_t minisketch_merge(minisketch* sketch, const minisketch* other_sketch) {
    Sketch* s1 = (Sketch*)sketch;
    const Sketch* s2 = (const Sketch*)other_sketch;
    s1->Check();
    s2->Check();
    if (s1->Bits() != s2->Bits()) return 0;
    if (s1->Implementation() != s2->Implementation()) return 0;
    return s1->Merge(s2);
}